

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O1

void __thiscall
VectorSUnitTest_emplace_back_Test::~VectorSUnitTest_emplace_back_Test
          (VectorSUnitTest_emplace_back_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(VectorSUnitTest, emplace_back)
{
    vector_s<Rect, 6> v{};
    EXPECT_EQ(0u, v.size());

    const auto& ret1 = v.emplace_back(1u,2u);
    EXPECT_EQ(Rect(1u, 2u), ret1);
    EXPECT_EQ(Rect(1u, 2u), v.back());
    EXPECT_EQ(1u, v.size());

    const auto& ret2 = v.emplace_back(2u,3u);
    EXPECT_EQ(Rect(2u, 3u), ret2);
    EXPECT_EQ(Rect(2u, 3u), v.back());
    EXPECT_EQ(2u, v.size());
}